

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall summarycalc::dosummaryprocessing(summarycalc *this,int samplesize)

{
  bool bVar1;
  size_t sVar2;
  int local_34;
  OASIS_FLOAT local_30;
  sampleslevelRec sr;
  int cov_id;
  OASIS_FLOAT expure_val;
  int i;
  int iStack_18;
  bool havedata;
  fmlevelhdr fh;
  int samplesize_local;
  summarycalc *this_local;
  
  fh.event_id = samplesize;
  unique0x10000117 = this;
  alloc_sssl_array(this,samplesize);
  reset_sssl_array(this,fh.event_id);
  alloc_sse_array(this);
  reset_sse_array(this);
  outputsamplesize(this,fh.event_id);
  bVar1 = false;
  do {
    sVar2 = fread(&i,8,1,_stdin);
    if ((int)sVar2 != 1) {
      if (bVar1) {
        outputsummary(this,fh.event_id,i);
      }
      return;
    }
    sr.loss = 0.0;
    sr.sidx = getcovid(this,iStack_18);
    if (!bVar1) {
      bVar1 = true;
    }
    cov_id = 1;
    while (cov_id != 0) {
      sVar2 = fread(&local_34,8,1,_stdin);
      cov_id = (int)sVar2;
      if ((cov_id == 0) || (local_34 == 0)) break;
      if (local_34 != -4) {
        if (local_34 == -3) {
          sr.loss = local_30;
        }
        else if (local_34 == -5) {
          dosummary_maxloss(this,fh.event_id,i,sr.sidx,-5,local_30);
        }
        else {
          dosummary(this,fh.event_id,i,iStack_18,sr.sidx,local_34,local_30,sr.loss);
        }
      }
    }
  } while( true );
}

Assistant:

void summarycalc::dosummaryprocessing(int samplesize)
{
	alloc_sssl_array(samplesize);
	reset_sssl_array(samplesize);
	alloc_sse_array();
	reset_sse_array();
	outputsamplesize(samplesize);
	fmlevelhdr fh;	
	bool havedata = false;
	int i = 1;
	while ((i = (int)fread(&fh, sizeof(fh), 1, stdin)) == 1) {
		OASIS_FLOAT expure_val = 0;
		int cov_id = getcovid(fh.output_id);
		if (i > 0 && havedata == false) havedata = true;
		while (i != 0) {
			sampleslevelRec sr;
			i = (int)fread(&sr, sizeof(sr), 1, stdin);
			if (i == 0) break;
			if (sr.sidx == 0) break;
			if (sr.sidx == number_of_affected_risk_idx) continue;
			if (sr.sidx == tiv_idx) {
				expure_val = sr.loss;
			} else if (sr.sidx == max_loss_idx) {
				dosummary_maxloss(samplesize, fh.event_id,
						  cov_id, sr.sidx, sr.loss);
			} else {
				dosummary(samplesize, fh.event_id, fh.output_id,
					  cov_id, sr.sidx, sr.loss, expure_val);
			}
		}
	}
	if (havedata) outputsummary(samplesize, fh.event_id);
}